

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugins_exts.c
# Opt level: O1

LY_ERR lyplg_ext_parse_extension_instance(lysp_ctx *pctx,lysp_ext_instance *ext)

{
  lysp_ext_substmt *plVar1;
  char *pcVar2;
  LY_ERR LVar3;
  lysp_stmt *plVar4;
  void **ppvVar5;
  void **ppvVar6;
  lysp_ext_substmt *plVar7;
  ly_ctx *ctx;
  char *pcVar8;
  
  plVar4 = ext->child;
  do {
    if (plVar4 == (lysp_stmt *)0x0) {
      ppvVar6 = (void **)0x0;
      while( true ) {
        if (ext->substmts == (lysp_ext_substmt *)0x0) {
          ppvVar5 = (void **)0x0;
        }
        else {
          ppvVar5 = ext->substmts[-1].storage_p;
        }
        if (ppvVar5 <= ppvVar6) break;
        for (plVar4 = ext->child; plVar4 != (lysp_stmt *)0x0; plVar4 = plVar4->next) {
          if ((ext->substmts[(long)ppvVar6].stmt == plVar4->kw) &&
             (LVar3 = lys_parser_ext_instance_stmt(pctx,ext->substmts + (long)ppvVar6,plVar4),
             LVar3 != LY_SUCCESS)) {
            return LVar3;
          }
        }
        ppvVar6 = (void **)((long)ppvVar6 + 1);
      }
      return LY_SUCCESS;
    }
    if ((plVar4->flags & 0xc00) == 0) {
      plVar1 = ext->substmts;
      ppvVar6 = (void **)0x0;
      plVar7 = plVar1;
      while( true ) {
        if (plVar1 == (lysp_ext_substmt *)0x0) {
          ppvVar5 = (void **)0x0;
        }
        else {
          ppvVar5 = plVar1[-1].storage_p;
        }
        if ((ppvVar5 <= ppvVar6) || (plVar7->stmt == plVar4->kw)) break;
        ppvVar6 = (void **)((long)ppvVar6 + 1);
        plVar7 = plVar7 + 1;
      }
      if (plVar1 == (lysp_ext_substmt *)0x0) {
        ppvVar5 = (void **)0x0;
      }
      else {
        ppvVar5 = plVar1[-1].storage_p;
      }
      if (ppvVar5 == ppvVar6) {
        if (pctx == (lysp_ctx *)0x0) {
          ctx = (ly_ctx *)0x0;
        }
        else {
          ctx = (ly_ctx *)
                **(undefined8 **)(pctx->parsed_mods->field_2).dnodes[pctx->parsed_mods->count - 1];
        }
        pcVar8 = ext->argument;
        pcVar2 = ", ";
        if (pcVar8 == (char *)0x0) {
          pcVar2 = "\t";
          pcVar8 = "";
        }
        ly_vlog(ctx,(char *)0x0,LYVE_SYNTAX_YANG,
                "Invalid keyword \"%s\" as a child of \"%s%s%s\" extension instance.",plVar4->stmt,
                ext->name,pcVar2 + 1,pcVar8);
        return LY_EVALID;
      }
    }
    plVar4 = plVar4->next;
  } while( true );
}

Assistant:

LIBYANG_API_DEF LY_ERR
lyplg_ext_parse_extension_instance(struct lysp_ctx *pctx, struct lysp_ext_instance *ext)
{
    LY_ERR rc = LY_SUCCESS;
    LY_ARRAY_COUNT_TYPE u;
    struct lysp_stmt *stmt;

    /* check for invalid substatements */
    LY_LIST_FOR(ext->child, stmt) {
        if (stmt->flags & (LYS_YIN_ATTR | LYS_YIN_ARGUMENT)) {
            continue;
        }
        LY_ARRAY_FOR(ext->substmts, u) {
            if (ext->substmts[u].stmt == stmt->kw) {
                break;
            }
        }
        if (u == LY_ARRAY_COUNT(ext->substmts)) {
            LOGVAL(PARSER_CTX(pctx), LYVE_SYNTAX_YANG, "Invalid keyword \"%s\" as a child of \"%s%s%s\" extension instance.",
                    stmt->stmt, ext->name, ext->argument ? " " : "", ext->argument ? ext->argument : "");
            rc = LY_EVALID;
            goto cleanup;
        }
    }

    /* parse all the known statements */
    LY_ARRAY_FOR(ext->substmts, u) {
        LY_LIST_FOR(ext->child, stmt) {
            if (ext->substmts[u].stmt != stmt->kw) {
                continue;
            }

            if ((rc = lys_parser_ext_instance_stmt(pctx, &ext->substmts[u], stmt))) {
                goto cleanup;
            }
        }
    }

cleanup:
    return rc;
}